

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamEuler.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementBeamEuler::ChElementBeamEuler(ChElementBeamEuler *this,void **vtt)

{
  undefined1 auVar1 [64];
  ChLoadableU CVar2;
  ChLoadableUVW CVar3;
  _func_int **pp_Var4;
  int iVar5;
  int iVar6;
  undefined1 auVar7 [64];
  
  (this->super_ChElementBeam).super_ChElementGeneric.Kmatr.super_ChKblock._vptr_ChKblock =
       (_func_int **)&PTR__ChKblockGeneric_01186748;
  (this->super_ChElementBeam).super_ChElementGeneric.Kmatr.K.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data = (double *)0x0;
  (this->super_ChElementBeam).super_ChElementGeneric.Kmatr.K.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows = 0;
  (this->super_ChElementBeam).super_ChElementGeneric.Kmatr.K.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols = 0;
  (this->super_ChElementBeam).super_ChElementGeneric.Kmatr.variables.
  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ChElementBeam).super_ChElementGeneric.Kmatr.K.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols = 0;
  (this->super_ChElementBeam).super_ChElementGeneric.Kmatr.variables.
  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ChElementBeam).super_ChElementGeneric.Kmatr.variables.
  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_ChElementBeam).super_ChElementGeneric.Kmatr.variables.
  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase =
       (_func_int **)&PTR__ChElementGeneric_0117d740;
  (this->super_ChElementBeam).mass = 0.0;
  (this->super_ChElementBeam).length = 0.0;
  CVar2 = *(ChLoadableU *)(vtt + 1);
  this->super_ChLoadableU = CVar2;
  *(void **)((long)((ChMatrixDynamic<double> *)(&this->super_ChElementCorotational + -1) + 2) + 0x10
            + *(long *)((long)CVar2 + -0x78)) = vtt[2];
  CVar3 = *(ChLoadableUVW *)(vtt + 3);
  this->super_ChLoadableUVW = CVar3;
  *(void **)((long)(this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array + *(long *)((long)CVar3 + -0x78) + -0x10) = vtt[4];
  ChElementCorotational::ChElementCorotational(&this->super_ChElementCorotational);
  pp_Var4 = (_func_int **)*vtt;
  (this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase =
       pp_Var4;
  this->super_ChLoadableU = *(ChLoadableU *)(vtt + 5);
  *(void **)((long)(this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array + (long)(pp_Var4[-3] + -0x68)) = vtt[6];
  this->super_ChLoadableUVW = *(ChLoadableUVW *)(vtt + 7);
  (this->super_ChElementCorotational)._vptr_ChElementCorotational = (_func_int **)0x117d370;
  this->use_numerical_diff_for_KR = false;
  auVar1 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
  this->nodes = (vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                 )auVar1._0_24_;
  this->section = (shared_ptr<chrono::fea::ChBeamSectionEuler>)auVar1._24_16_;
  this->Km = (ChMatrixDynamic<>)auVar1._40_24_;
  auVar1 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
  this->section = (shared_ptr<chrono::fea::ChBeamSectionEuler>)auVar1._0_16_;
  this->Km = (ChMatrixDynamic<>)auVar1._16_24_;
  this->Kg = (ChMatrixDynamic<>)auVar1._40_24_;
  auVar7 = vbroadcastf64x4_avx512f(_QUNIT);
  auVar1 = vmovdqu64_avx512f(auVar7);
  this->q_refrotA = (ChQuaternion<double>)auVar1._0_32_;
  this->q_refrotB = (ChQuaternion<double>)auVar1._32_32_;
  auVar1 = vmovdqu64_avx512f(auVar7);
  this->q_element_abs_rot = (ChQuaternion<double>)auVar1._0_32_;
  this->q_element_ref_rot = (ChQuaternion<double>)auVar1._32_32_;
  this->disable_corotate = false;
  this->force_symmetric_stiffness = false;
  this->use_geometric_stiffness = true;
  std::
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ::resize(&this->nodes,2);
  iVar5 = (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
            _vptr_ChElementBase[3])(this);
  iVar6 = (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
            _vptr_ChElementBase[3])(this);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::setZero
            (&(this->Km).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,
             (long)iVar5,(long)iVar6);
  iVar5 = (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
            _vptr_ChElementBase[3])(this);
  iVar6 = (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
            _vptr_ChElementBase[3])(this);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::setZero
            (&(this->Kg).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,
             (long)iVar5,(long)iVar6);
  return;
}

Assistant:

ChElementBeamEuler::ChElementBeamEuler()
    : q_refrotA(QUNIT),
      q_refrotB(QUNIT),
      q_element_abs_rot(QUNIT),
      q_element_ref_rot(QUNIT),
      disable_corotate(false),
      force_symmetric_stiffness(false),
      use_geometric_stiffness(true)
{
    nodes.resize(2);

    Km.setZero(this->GetNdofs(), this->GetNdofs());
    Kg.setZero(this->GetNdofs(), this->GetNdofs());
}